

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_request * fxp_setstat_send(char *fname,fxp_attrs attrs)

{
  sftp_request *psVar1;
  sftp_packet *pkt;
  sftp_packet *pktout;
  sftp_request *req;
  char *fname_local;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(9);
  BinarySink_put_uint32(pkt->binarysink_,(ulong)psVar1->id);
  BinarySink_put_stringz(pkt->binarysink_,fname);
  BinarySink_put_fxp_attrs(pkt->binarysink_,attrs);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_setstat_send(const char *fname,
                                      struct fxp_attrs attrs)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_SETSTAT);
    put_uint32(pktout, req->id);
    put_stringz(pktout, fname);
    put_fxp_attrs(pktout, attrs);
    sftp_send(pktout);

    return req;
}